

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

char * restrict_bit_name(long *restrict_flags)

{
  restrict_type *prVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  restrict_type *prVar6;
  double dVar7;
  
  restrict_bit_name::buf[0] = '\0';
  prVar6 = restrict_table;
  do {
    uVar2 = prVar6->bit;
    uVar5 = uVar2 + 0x1f;
    if (-1 < (long)uVar2) {
      uVar5 = uVar2;
    }
    uVar5 = restrict_flags[(int)(uVar5 >> 5)];
    dVar7 = exp2((double)((long)uVar2 % 0x20));
    if ((uVar5 & (long)dVar7) != 0) {
      sVar3 = strlen(restrict_bit_name::buf);
      (restrict_bit_name::buf + sVar3)[0] = ' ';
      (restrict_bit_name::buf + sVar3)[1] = '\0';
      pcVar4 = palloc_string(prVar6->name);
      strcat(restrict_bit_name::buf,pcVar4);
    }
    prVar1 = prVar6 + 1;
    prVar6 = prVar6 + 1;
  } while (prVar1->name != (char *)0x0);
  pcVar4 = restrict_bit_name::buf;
  if (restrict_bit_name::buf[0] == '\0') {
    pcVar4 = " none";
  }
  return pcVar4 + 1;
}

Assistant:

char *restrict_bit_name(long restrict_flags[])
{
	static char buf[512];
	buf[0] = '\0';

	for (int i = 0; restrict_table[i].name != nullptr; i++)
	{
		if (IS_SET(restrict_flags, restrict_table[i].bit))
		{
			strcat(buf, " ");
			strcat(buf, palloc_string(restrict_table[i].name));
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}